

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extractor.cpp
# Opt level: O1

void __thiscall Extractor::~Extractor(Extractor *this)

{
  pointer pcVar1;
  pointer ppWVar2;
  void *in_RSI;
  
  _free(this,in_RSI);
  pcVar1 = (this->_file_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_file_name).field_2) {
    operator_delete(pcVar1);
  }
  ppWVar2 = (this->super_vector<WaveFile_*,_std::allocator<WaveFile_*>_>).
            super__Vector_base<WaveFile_*,_std::allocator<WaveFile_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppWVar2 != (pointer)0x0) {
    operator_delete(ppWVar2);
    return;
  }
  return;
}

Assistant:

Extractor::~Extractor()
{
	_free();
}